

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseInstr(WastParser *this,ExprList *exprs)

{
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> uVar1;
  bool bVar2;
  TokenType TVar3;
  Result result;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_50;
  Enum local_44;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_40;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> expr_1;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_28;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> expr;
  ExprList *exprs_local;
  WastParser *this_local;
  
  expr._M_t.super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
  super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::Expr,_std::default_delete<wabt::Expr>,_true,_true>)
       (__uniq_ptr_data<wabt::Expr,_std::default_delete<wabt::Expr>,_true,_true>)exprs;
  TVar3 = Peek(this,0);
  bVar2 = anon_unknown_1::IsPlainInstr(TVar3);
  if (bVar2) {
    std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
    unique_ptr<std::default_delete<wabt::Expr>,void>
              ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_28);
    result = ParsePlainInstr(this,&local_28);
    bVar2 = Failed(result);
    uVar1 = expr;
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::unique_ptr(&expr_1,&local_28);
      intrusive_list<wabt::Expr>::push_back
                ((intrusive_list<wabt::Expr> *)
                 uVar1._M_t.super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t
                 .super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                 super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl,&expr_1);
      std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&expr_1);
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_28);
  }
  else {
    TVar3 = Peek(this,0);
    bVar2 = anon_unknown_1::IsBlockInstr(TVar3);
    if (bVar2) {
      std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
      unique_ptr<std::default_delete<wabt::Expr>,void>
                ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_40);
      local_44 = (Enum)ParseBlockInstr(this,&local_40);
      bVar2 = Failed((Result)local_44);
      uVar1 = expr;
      if (bVar2) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::unique_ptr
                  (&local_50,&local_40);
        intrusive_list<wabt::Expr>::push_back
                  ((intrusive_list<wabt::Expr> *)
                   uVar1._M_t.super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
                   _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                   super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl,&local_50);
        std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_50);
        Result::Result((Result *)((long)&this_local + 4),Ok);
      }
      std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_40);
    }
    else {
      bVar2 = PeekMatchExpr(this);
      if (!bVar2) {
        __assert_fail("!\"ParseInstr should only be called when IsInstr() is true\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                      ,0x85d,"Result wabt::WastParser::ParseInstr(ExprList *)");
      }
      this_local._4_4_ =
           ParseExpr(this,(ExprList *)
                          expr._M_t.
                          super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
                          super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseInstr(ExprList* exprs) {
  WABT_TRACE(ParseInstr);
  if (IsPlainInstr(Peek())) {
    std::unique_ptr<Expr> expr;
    CHECK_RESULT(ParsePlainInstr(&expr));
    exprs->push_back(std::move(expr));
    return Result::Ok;
  } else if (IsBlockInstr(Peek())) {
    std::unique_ptr<Expr> expr;
    CHECK_RESULT(ParseBlockInstr(&expr));
    exprs->push_back(std::move(expr));
    return Result::Ok;
  } else if (PeekMatchExpr()) {
    return ParseExpr(exprs);
  } else {
    assert(!"ParseInstr should only be called when IsInstr() is true");
    return Result::Error;
  }
}